

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_acos>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  long *in_RDI;
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 in_ZMM2 [64];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_acos op;
  Mat *m;
  __m256 big_final_approx;
  __m256 small_final_approx;
  __m256 x1;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 big_input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_pi;
  __m256 magic_half_pi;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_one;
  __m256 magic_half_one;
  __m256 magic_zero;
  __m256 magic_negative_zero;
  __m128 big_final_approx_1;
  __m128 small_final_approx_1;
  __m128 x1_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 big_input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_pi_1;
  __m128 magic_half_pi_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_one_1;
  __m128 magic_half_one_1;
  __m128 magic_zero_1;
  __m128 magic_negative_zero_1;
  undefined1 local_1790 [16];
  undefined1 local_1780 [32];
  int local_175c;
  undefined8 local_1758;
  undefined8 local_1750;
  undefined8 local_1748;
  undefined4 local_1740;
  long local_1738;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  undefined4 local_1724;
  undefined4 local_1720;
  undefined8 local_1718;
  undefined1 (*local_1710) [32];
  int local_1708;
  int local_1704;
  int local_1700;
  int local_16fc;
  int local_16f8;
  int local_16f4;
  int local_16f0;
  undefined1 local_16e9 [9];
  long *local_16e0;
  undefined1 local_16d5;
  int local_16d4;
  undefined8 *local_16c8;
  undefined8 *local_16c0;
  undefined8 *local_16b0;
  undefined1 (*local_16a8) [32];
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined1 (*local_1670) [32];
  undefined1 (*local_1668) [32];
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined1 (*local_1650) [32];
  long local_1648;
  undefined4 local_163c;
  long local_1638;
  undefined1 (*local_1630) [32];
  undefined4 local_1624;
  int local_1620;
  int local_161c;
  undefined8 *local_1618;
  undefined4 local_160c;
  long local_1608;
  undefined8 *local_15f8;
  undefined1 *local_15d0;
  undefined1 *local_15c8;
  undefined1 *local_15c0;
  undefined1 *local_15b8;
  undefined1 (*local_15b0) [32];
  undefined1 *local_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined1 local_1580 [32];
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  undefined4 uStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined4 uStack_1484;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  undefined4 uStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 local_1120 [32];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined1 local_fe0 [8];
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  undefined4 uStack_f84;
  undefined1 *local_f78;
  undefined1 *local_f70;
  float *local_f68;
  undefined8 *local_f60;
  undefined1 *local_f58;
  float *local_f50;
  undefined8 *local_f48;
  undefined8 *local_f40;
  float *local_f38;
  undefined8 *local_f30;
  undefined1 *local_f28;
  float *local_f20;
  undefined8 *local_f18;
  undefined8 *local_f10;
  float *local_f08;
  undefined1 local_f00 [8];
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  undefined1 local_ee0 [8];
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  ulong uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  ulong uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  undefined4 uStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  ulong uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [32];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined4 local_ad0;
  undefined4 local_acc;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  undefined1 local_790 [16];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined1 *local_448;
  undefined1 *local_440;
  float *local_438;
  undefined8 *local_430;
  undefined1 *local_428;
  float *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  float *local_408;
  undefined8 *local_400;
  undefined1 *local_3f8;
  float *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  float *local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_34;
  
  local_16f0 = *(int *)((long)in_RDI + 0x2c);
  local_16f4 = (int)in_RDI[6];
  local_16f8 = *(int *)((long)in_RDI + 0x34);
  local_16fc = (int)in_RDI[7];
  local_1700 = (int)in_RDI[3];
  local_1704 = local_16f0 * local_16f4 * local_16f8 * local_1700;
  local_16e0 = in_RDI;
  for (local_1708 = 0; local_1708 < local_16fc; local_1708 = local_1708 + 1) {
    local_16c8 = &local_1758;
    local_161c = *(int *)((long)local_16e0 + 0x2c);
    local_1620 = (int)local_16e0[6];
    local_1624 = *(undefined4 *)((long)local_16e0 + 0x34);
    local_1630 = (undefined1 (*) [32])
                 (*local_16e0 + local_16e0[8] * (long)local_1708 * local_16e0[2]);
    local_1638 = local_16e0[2];
    local_163c = (undefined4)local_16e0[3];
    local_1648 = local_16e0[4];
    local_1618 = &local_1758;
    local_1608 = (long)local_161c * (long)local_1620 * local_1638;
    local_16c0 = &local_1758;
    local_16b0 = &local_1758;
    local_160c = 0x10;
    local_16d4 = local_1708;
    local_16d5 = 1;
    local_1758 = 0;
    local_1748 = 0;
    local_1740 = 0;
    local_1730 = 0;
    local_172c = 0;
    local_1728 = 0;
    local_1724 = 0;
    local_1720 = 0;
    local_1718 = 0;
    local_1750 = 0;
    local_1710 = local_1630;
    for (local_175c = 0; local_175c + 7 < local_1704; local_175c = local_175c + 8) {
      local_16a8 = local_1710;
      auVar11 = *local_1710;
      local_15c8 = local_16e9;
      local_15d0 = local_1780;
      local_1780._0_8_ = auVar11._0_8_;
      local_1240 = local_1780._0_8_;
      local_1780._8_8_ = auVar11._8_8_;
      uStack_1238 = local_1780._8_8_;
      local_1780._16_8_ = auVar11._16_8_;
      uStack_1230 = local_1780._16_8_;
      local_1780._24_8_ = auVar11._24_8_;
      uStack_1228 = local_1780._24_8_;
      local_aa4 = 0x80000000;
      local_a80 = 0x80000000;
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      local_aa0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      auStack_a90 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      local_1260 = local_aa0._0_8_;
      uStack_1258 = local_aa0._8_8_;
      uStack_1250 = auStack_a90._0_8_;
      uStack_1248 = auStack_a90._8_8_;
      local_aa8 = 0;
      local_a40 = 0;
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      local_a60 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
      auStack_a50 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
      local_1280 = local_a60._0_8_;
      uStack_1278 = local_a60._8_8_;
      uStack_1270 = auStack_a50._0_8_;
      uStack_1268 = auStack_a50._8_8_;
      local_aac = 0x3f000000;
      local_a00 = 0x3f000000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
      local_a20 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x20);
      auStack_a10 = vinsertps_avx(auVar2,ZEXT416(0x3f000000),0x30);
      local_12a0 = local_a20._0_8_;
      uStack_1298 = local_a20._8_8_;
      uStack_1290 = auStack_a10._0_8_;
      uStack_1288 = auStack_a10._8_8_;
      local_ab0 = 0x3f800000;
      local_9c0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_9e0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_9d0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_12c0 = local_9e0._0_8_;
      uStack_12b8 = local_9e0._8_8_;
      uStack_12b0 = auStack_9d0._0_8_;
      uStack_12a8 = auStack_9d0._8_8_;
      local_ab4 = 0x3cc48f19;
      local_980 = 0x3cc48f19;
      auVar2 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x20);
      local_9a0 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x20);
      auStack_990 = vinsertps_avx(auVar2,ZEXT416(0x3cc48f19),0x30);
      local_12e0 = local_9a0._0_8_;
      uStack_12d8 = local_9a0._8_8_;
      uStack_12d0 = auStack_990._0_8_;
      uStack_12c8 = auStack_990._8_8_;
      local_ab8 = 0x3d2dbdcf;
      local_940 = 0x3d2dbdcf;
      auVar2 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x20);
      local_960 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x20);
      auStack_950 = vinsertps_avx(auVar2,ZEXT416(0x3d2dbdcf),0x30);
      local_1300 = local_960._0_8_;
      uStack_12f8 = local_960._8_8_;
      uStack_12f0 = auStack_950._0_8_;
      uStack_12e8 = auStack_950._8_8_;
      local_abc = 0x3d997dcc;
      local_900 = 0x3d997dcc;
      auVar2 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x20);
      local_920 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x20);
      auStack_910 = vinsertps_avx(auVar2,ZEXT416(0x3d997dcc),0x30);
      local_1320 = local_920._0_8_;
      uStack_1318 = local_920._8_8_;
      uStack_1310 = auStack_910._0_8_;
      uStack_1308 = auStack_910._8_8_;
      local_ac0 = 0x3d3a73d8;
      local_8c0 = 0x3d3a73d8;
      auVar2 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x20);
      local_8e0 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x20);
      auStack_8d0 = vinsertps_avx(auVar2,ZEXT416(0x3d3a73d8),0x30);
      local_1340 = local_8e0._0_8_;
      uStack_1338 = local_8e0._8_8_;
      uStack_1330 = auStack_8d0._0_8_;
      uStack_1328 = auStack_8d0._8_8_;
      local_ac4 = 0x3f800000;
      local_880 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_8a0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_890 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1360 = local_8a0._0_8_;
      uStack_1358 = local_8a0._8_8_;
      uStack_1350 = auStack_890._0_8_;
      uStack_1348 = auStack_890._8_8_;
      local_ac8 = 0x3e2aaaf8;
      local_840 = 0x3e2aaaf8;
      auVar2 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x20);
      local_860 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x20);
      auStack_850 = vinsertps_avx(auVar2,ZEXT416(0x3e2aaaf8),0x30);
      local_1380 = local_860._0_8_;
      uStack_1378 = local_860._8_8_;
      uStack_1370 = auStack_850._0_8_;
      uStack_1368 = auStack_850._8_8_;
      local_acc = 0x3fc90fdb;
      local_800 = 0x3fc90fdb;
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      local_820 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      auStack_810 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      local_13a0 = local_820._0_8_;
      uStack_1398 = local_820._8_8_;
      uStack_1390 = auStack_810._0_8_;
      uStack_1388 = auStack_810._8_8_;
      local_ad0 = 0x40490fdb;
      local_7c0 = 0x40490fdb;
      auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
      local_7e0 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
      auStack_7d0 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
      local_13c0 = local_7e0._0_8_;
      uStack_13b8 = local_7e0._8_8_;
      uStack_13b0 = auStack_7d0._0_8_;
      uStack_13a8 = auStack_7d0._8_8_;
      local_1140 = local_aa0._0_8_;
      uStack_1138 = local_aa0._8_8_;
      uStack_1130 = auStack_a90._0_8_;
      uStack_1128 = auStack_a90._8_8_;
      auVar1._16_8_ = auStack_a90._0_8_;
      auVar1._0_16_ = local_aa0;
      auVar1._24_8_ = auStack_a90._8_8_;
      local_13e0 = vandps_avx(auVar1,auVar11);
      local_b00 = local_aa0._0_8_;
      uStack_af8 = local_aa0._8_8_;
      uStack_af0 = auStack_a90._0_8_;
      uStack_ae8 = auStack_a90._8_8_;
      auVar18._16_8_ = auStack_a90._0_8_;
      auVar18._0_16_ = local_aa0;
      auVar18._24_8_ = auStack_a90._8_8_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_1400 = vandnps_avx(auVar18,auVar11);
      auVar9._16_8_ = auStack_a10._0_8_;
      auVar9._0_16_ = local_a20;
      auVar9._24_8_ = auStack_a10._8_8_;
      local_1420 = vcmpps_avx(local_1400,auVar9,2);
      local_10c0 = local_9e0._0_8_;
      uStack_10b8 = local_9e0._8_8_;
      uStack_10b0 = auStack_9d0._0_8_;
      uStack_10a8 = auStack_9d0._8_8_;
      local_10e0 = local_1400._0_8_;
      uStack_10d8 = local_1400._8_8_;
      uStack_10d0 = local_1400._16_8_;
      uStack_10c8 = local_1400._24_8_;
      auVar13._16_8_ = auStack_9d0._0_8_;
      auVar13._0_16_ = local_9e0;
      auVar13._24_8_ = auStack_9d0._8_8_;
      _local_fe0 = vsubps_avx(auVar13,local_1400);
      local_fc0._0_4_ = local_a20._0_4_;
      local_fc0._4_4_ = local_a20._4_4_;
      uStack_fb8._0_4_ = local_a20._8_4_;
      uStack_fb8._4_4_ = local_a20._12_4_;
      uStack_fb0._0_4_ = auStack_a10._0_4_;
      uStack_fb0._4_4_ = auStack_a10._4_4_;
      uStack_fa8._0_4_ = auStack_a10._8_4_;
      uStack_fa8._4_4_ = auStack_a10._12_4_;
      uStack_f84 = uStack_fa8._4_4_;
      local_fa0 = (float)local_fc0 * (float)local_fe0._0_4_;
      fStack_f9c = local_fc0._4_4_ * (float)local_fe0._4_4_;
      fStack_f98 = (float)uStack_fb8 * fStack_fd8;
      fStack_f94 = uStack_fb8._4_4_ * fStack_fd4;
      fStack_f90 = (float)uStack_fb0 * fStack_fd0;
      fStack_f8c = uStack_fb0._4_4_ * fStack_fcc;
      fStack_f88 = (float)uStack_fa8 * fStack_fc8;
      auVar14._4_4_ = fStack_f9c;
      auVar14._0_4_ = local_fa0;
      auVar14._8_4_ = fStack_f98;
      auVar14._12_4_ = fStack_f94;
      auVar14._16_4_ = fStack_f90;
      auVar14._20_4_ = fStack_f8c;
      auVar14._24_4_ = fStack_f88;
      auVar14._28_4_ = uStack_fa8._4_4_;
      local_1440 = vsqrtps_avx(auVar14);
      local_1180 = local_1420._0_8_;
      uStack_1178 = local_1420._8_8_;
      uStack_1170 = local_1420._16_8_;
      uStack_1168 = local_1420._24_8_;
      local_11a0 = local_1400._0_8_;
      uStack_1198 = local_1400._8_8_;
      uStack_1190 = local_1400._16_8_;
      uStack_1188 = local_1400._24_8_;
      local_bc0 = vandps_avx(local_1420,local_1400);
      local_b40 = local_1420._0_8_;
      uStack_b38 = local_1420._8_8_;
      uStack_b30 = local_1420._16_8_;
      uStack_b28 = local_1420._24_8_;
      local_b60 = local_1440._0_8_;
      uStack_b58 = local_1440._8_8_;
      uStack_b50 = local_1440._16_8_;
      uStack_b48 = local_1440._24_8_;
      local_be0 = vandnps_avx(local_1420,local_1440);
      local_1460 = vorps_avx(local_bc0,local_be0);
      local_1020 = local_1460._0_8_;
      uStack_1018 = local_1460._8_8_;
      uStack_1010 = local_1460._16_8_;
      uStack_1008 = local_1460._24_8_;
      local_1000._0_4_ = local_1460._0_4_;
      local_1000._4_4_ = local_1460._4_4_;
      uStack_ff8._0_4_ = local_1460._8_4_;
      uStack_ff8._4_4_ = local_1460._12_4_;
      uStack_ff0._0_4_ = local_1460._16_4_;
      uStack_ff0._4_4_ = local_1460._20_4_;
      uStack_fe8._0_4_ = local_1460._24_4_;
      uStack_fe8._4_4_ = local_1460._28_4_;
      uStack_1464 = uStack_fe8._4_4_;
      local_1480 = (float)local_1000 * (float)local_1000;
      fStack_147c = local_1000._4_4_ * local_1000._4_4_;
      fStack_1478 = (float)uStack_ff8 * (float)uStack_ff8;
      fStack_1474 = uStack_ff8._4_4_ * uStack_ff8._4_4_;
      fStack_1470 = (float)uStack_ff0 * (float)uStack_ff0;
      fStack_146c = uStack_ff0._4_4_ * uStack_ff0._4_4_;
      fStack_1468 = (float)uStack_fe8 * (float)uStack_fe8;
      local_1060 = CONCAT44(fStack_147c,local_1480);
      uStack_1058 = CONCAT44(fStack_1474,fStack_1478);
      uStack_1050 = CONCAT44(fStack_146c,fStack_1470);
      uStack_1048 = CONCAT44(uStack_fe8._4_4_,fStack_1468);
      uStack_1484 = uStack_fe8._4_4_;
      local_14a0 = local_1480 * local_1480;
      fStack_149c = fStack_147c * fStack_147c;
      fStack_1498 = fStack_1478 * fStack_1478;
      fStack_1494 = fStack_1474 * fStack_1474;
      fStack_1490 = fStack_1470 * fStack_1470;
      fStack_148c = fStack_146c * fStack_146c;
      fStack_1488 = fStack_1468 * fStack_1468;
      local_f50 = &local_14a0;
      local_f10 = &local_1300;
      local_f18 = &local_1340;
      local_e40 = CONCAT44(fStack_149c,local_14a0);
      uStack_e38 = CONCAT44(fStack_1494,fStack_1498);
      uStack_e30 = CONCAT44(fStack_148c,fStack_1490);
      uStack_e28 = CONCAT44(uStack_fe8._4_4_,fStack_1488);
      auVar24._4_4_ = fStack_149c;
      auVar24._0_4_ = local_14a0;
      auVar24._8_4_ = fStack_1498;
      auVar24._12_4_ = fStack_1494;
      auVar24._16_4_ = fStack_1490;
      auVar24._20_4_ = fStack_148c;
      auVar24._24_4_ = fStack_1488;
      auVar24._28_4_ = uStack_fe8._4_4_;
      local_e60 = local_960._0_8_;
      uStack_e58 = local_960._8_8_;
      uStack_e50 = auStack_950._0_8_;
      uStack_e48 = auStack_950._8_8_;
      auVar33._16_8_ = auStack_950._0_8_;
      auVar33._0_16_ = local_960;
      auVar33._24_8_ = auStack_950._8_8_;
      local_e80 = local_8e0._0_8_;
      uStack_e78 = local_8e0._8_8_;
      uStack_e70 = auStack_8d0._0_8_;
      uStack_e68 = auStack_8d0._8_8_;
      auVar31._16_8_ = auStack_8d0._0_8_;
      auVar31._0_16_ = local_8e0;
      auVar31._24_8_ = auStack_8d0._8_8_;
      auVar2 = vfmadd213ps_fma(auVar33,auVar24,auVar31);
      local_f28 = local_1500;
      local_f30 = &local_1380;
      local_de0 = CONCAT44(fStack_149c,local_14a0);
      uStack_dd8 = CONCAT44(fStack_1494,fStack_1498);
      uStack_dd0 = CONCAT44(fStack_148c,fStack_1490);
      uStack_dc8 = CONCAT44(uStack_fe8._4_4_,fStack_1488);
      auVar25._4_4_ = fStack_149c;
      auVar25._0_4_ = local_14a0;
      auVar25._8_4_ = fStack_1498;
      auVar25._12_4_ = fStack_1494;
      auVar25._16_4_ = fStack_1490;
      auVar25._20_4_ = fStack_148c;
      auVar25._24_4_ = fStack_1488;
      auVar25._28_4_ = uStack_fe8._4_4_;
      local_1500._0_8_ = auVar2._0_8_;
      local_e00 = local_1500._0_8_;
      local_1500._8_8_ = auVar2._8_8_;
      uStack_df8 = local_1500._8_8_;
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_e20 = local_860._0_8_;
      uStack_e18 = local_860._8_8_;
      uStack_e10 = auStack_850._0_8_;
      uStack_e08 = auStack_850._8_8_;
      auVar29._16_8_ = auStack_850._0_8_;
      auVar29._0_16_ = local_860;
      auVar29._24_8_ = auStack_850._8_8_;
      auVar3 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar25,auVar29);
      local_f40 = &local_12e0;
      local_f48 = &local_1320;
      local_d80 = CONCAT44(fStack_149c,local_14a0);
      uStack_d78 = CONCAT44(fStack_1494,fStack_1498);
      uStack_d70 = CONCAT44(fStack_148c,fStack_1490);
      uStack_d68 = CONCAT44(uStack_fe8._4_4_,fStack_1488);
      auVar26._4_4_ = fStack_149c;
      auVar26._0_4_ = local_14a0;
      auVar26._8_4_ = fStack_1498;
      auVar26._12_4_ = fStack_1494;
      auVar26._16_4_ = fStack_1490;
      auVar26._20_4_ = fStack_148c;
      auVar26._24_4_ = fStack_1488;
      auVar26._28_4_ = uStack_fe8._4_4_;
      local_da0 = local_9a0._0_8_;
      uStack_d98 = local_9a0._8_8_;
      uStack_d90 = auStack_990._0_8_;
      uStack_d88 = auStack_990._8_8_;
      auVar34._16_8_ = auStack_990._0_8_;
      auVar34._0_16_ = local_9a0;
      auVar34._24_8_ = auStack_990._8_8_;
      local_dc0 = local_920._0_8_;
      uStack_db8 = local_920._8_8_;
      uStack_db0 = auStack_910._0_8_;
      uStack_da8 = auStack_910._8_8_;
      auVar32._16_8_ = auStack_910._0_8_;
      auVar32._0_16_ = local_920;
      auVar32._24_8_ = auStack_910._8_8_;
      auVar4 = vfmadd213ps_fma(auVar34,auVar26,auVar32);
      local_f58 = local_1540;
      local_f60 = &local_1360;
      local_d20 = CONCAT44(fStack_149c,local_14a0);
      uStack_d18 = CONCAT44(fStack_1494,fStack_1498);
      uStack_d10 = CONCAT44(fStack_148c,fStack_1490);
      uStack_d08 = CONCAT44(uStack_fe8._4_4_,fStack_1488);
      auVar27._4_4_ = fStack_149c;
      auVar27._0_4_ = local_14a0;
      auVar27._8_4_ = fStack_1498;
      auVar27._12_4_ = fStack_1494;
      auVar27._16_4_ = fStack_1490;
      auVar27._20_4_ = fStack_148c;
      auVar27._24_4_ = fStack_1488;
      auVar27._28_4_ = uStack_fe8._4_4_;
      local_1540._0_8_ = auVar4._0_8_;
      local_d40 = local_1540._0_8_;
      local_1540._8_8_ = auVar4._8_8_;
      uStack_d38 = local_1540._8_8_;
      uStack_d30 = 0;
      uStack_d28 = 0;
      local_d60 = local_8a0._0_8_;
      uStack_d58 = local_8a0._8_8_;
      uStack_d50 = auStack_890._0_8_;
      uStack_d48 = auStack_890._8_8_;
      auVar30._16_8_ = auStack_890._0_8_;
      auVar30._0_16_ = local_8a0;
      auVar30._24_8_ = auStack_890._8_8_;
      auVar5 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar27,auVar30);
      local_f68 = &local_1480;
      local_f70 = local_14e0;
      local_f78 = local_1520;
      local_cc0 = CONCAT44(fStack_147c,local_1480);
      uStack_cb8 = CONCAT44(fStack_1474,fStack_1478);
      uStack_cb0 = CONCAT44(fStack_146c,fStack_1470);
      uStack_ca8 = CONCAT44(uStack_fe8._4_4_,fStack_1468);
      auVar28._4_4_ = fStack_147c;
      auVar28._0_4_ = local_1480;
      auVar28._8_4_ = fStack_1478;
      auVar28._12_4_ = fStack_1474;
      auVar28._16_4_ = fStack_1470;
      auVar28._20_4_ = fStack_146c;
      auVar28._24_4_ = fStack_1468;
      auVar28._28_4_ = uStack_fe8._4_4_;
      local_14e0._0_8_ = auVar3._0_8_;
      local_ce0 = local_14e0._0_8_;
      local_14e0._8_8_ = auVar3._8_8_;
      uStack_cd8 = local_14e0._8_8_;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_1520._0_8_ = auVar5._0_8_;
      local_d00 = local_1520._0_8_;
      local_1520._8_8_ = auVar5._8_8_;
      uStack_cf8 = local_1520._8_8_;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      auVar6 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar28,ZEXT1632(auVar5));
      local_14c0._0_8_ = auVar6._0_8_;
      uVar7 = local_14c0._0_8_;
      local_14c0._8_8_ = auVar6._8_8_;
      uVar8 = local_14c0._8_8_;
      uStack_1070 = 0;
      uStack_1068 = 0;
      local_10a0 = local_1460._0_8_;
      uStack_1098 = local_1460._8_8_;
      uStack_1090 = local_1460._16_8_;
      uStack_1088 = local_1460._24_8_;
      local_1080._0_4_ = auVar6._0_4_;
      local_1080._4_4_ = auVar6._4_4_;
      uStack_1078._0_4_ = auVar6._8_4_;
      uStack_1078._4_4_ = auVar6._12_4_;
      uStack_1544 = 0;
      local_1560 = (float)local_1080 * (float)local_1000;
      fStack_155c = local_1080._4_4_ * local_1000._4_4_;
      fStack_1558 = (float)uStack_1078 * (float)uStack_ff8;
      fStack_1554 = uStack_1078._4_4_ * uStack_ff8._4_4_;
      fStack_1550 = (float)uStack_ff0 * 0.0;
      fStack_154c = uStack_ff0._4_4_ * 0.0;
      fStack_1548 = (float)uStack_fe8 * 0.0;
      local_1100 = local_820._0_8_;
      uStack_10f8 = local_820._8_8_;
      uStack_10f0 = auStack_810._0_8_;
      uStack_10e8 = auStack_810._8_8_;
      local_c00 = CONCAT44(fStack_155c,local_1560);
      uStack_bf8 = CONCAT44(fStack_1554,fStack_1558);
      uStack_bf0 = CONCAT44(fStack_154c,fStack_1550);
      uStack_be8 = (ulong)(uint)fStack_1548;
      local_c20 = local_13e0._0_8_;
      uStack_c18 = local_13e0._8_8_;
      uStack_c10 = local_13e0._16_8_;
      uStack_c08 = local_13e0._24_8_;
      auVar16._8_8_ = uStack_bf8;
      auVar16._0_8_ = local_c00;
      auVar16._16_8_ = uStack_bf0;
      auVar16._24_4_ = fStack_1548;
      auVar16._28_4_ = 0;
      local_1120 = vorps_avx(auVar16,local_13e0);
      auVar12._16_8_ = auStack_810._0_8_;
      auVar12._0_16_ = local_820;
      auVar12._24_8_ = auStack_810._8_8_;
      local_1580 = vsubps_avx(auVar12,local_1120);
      auVar10._16_8_ = auStack_a50._0_8_;
      auVar10._0_16_ = local_a60;
      auVar10._24_8_ = auStack_a50._8_8_;
      local_11c0 = vcmpps_avx(auVar11,auVar10,1);
      local_11e0 = local_7e0._0_8_;
      uStack_11d8 = local_7e0._8_8_;
      uStack_11d0 = auStack_7d0._0_8_;
      uStack_11c8 = auStack_7d0._8_8_;
      auVar11._16_8_ = auStack_7d0._0_8_;
      auVar11._0_16_ = local_7e0;
      auVar11._24_8_ = auStack_7d0._8_8_;
      _local_ee0 = vandps_avx(local_11c0,auVar11);
      local_ec0 = CONCAT44(fStack_155c,local_1560);
      uStack_eb8 = CONCAT44(fStack_1554,fStack_1558);
      uStack_eb0 = CONCAT44(fStack_154c,fStack_1550);
      uStack_ea8 = (ulong)(uint)fStack_1548;
      local_c40 = local_1560 + local_1560;
      fStack_c3c = fStack_155c + fStack_155c;
      fStack_c38 = fStack_1558 + fStack_1558;
      fStack_c34 = fStack_1554 + fStack_1554;
      fStack_c30 = fStack_1550 + fStack_1550;
      fStack_c2c = fStack_154c + fStack_154c;
      fStack_c28 = fStack_1548 + fStack_1548;
      uStack_c24 = 0;
      local_c60 = local_13e0._0_8_;
      uStack_c58 = local_13e0._8_8_;
      uStack_c50 = local_13e0._16_8_;
      uStack_c48 = local_13e0._24_8_;
      auVar15._4_4_ = fStack_c3c;
      auVar15._0_4_ = local_c40;
      auVar15._8_4_ = fStack_c38;
      auVar15._12_4_ = fStack_c34;
      auVar15._16_4_ = fStack_c30;
      auVar15._20_4_ = fStack_c2c;
      auVar15._24_4_ = fStack_c28;
      auVar15._28_4_ = 0;
      _local_f00 = vorps_avx(auVar15,local_13e0);
      local_15a0 = (float)local_ee0._0_4_ + (float)local_f00._0_4_;
      fStack_159c = (float)local_ee0._4_4_ + (float)local_f00._4_4_;
      fStack_1598 = fStack_ed8 + fStack_ef8;
      fStack_1594 = fStack_ed4 + fStack_ef4;
      fStack_1590 = fStack_ed0 + fStack_ef0;
      fStack_158c = fStack_ecc + fStack_eec;
      fStack_1588 = fStack_ec8 + fStack_ee8;
      fStack_1584 = fStack_ec4 + fStack_ee4;
      local_1200 = local_1420._0_8_;
      uStack_11f8 = local_1420._8_8_;
      uStack_11f0 = local_1420._16_8_;
      uStack_11e8 = local_1420._24_8_;
      local_1220 = local_1580._0_8_;
      uStack_1218 = local_1580._8_8_;
      uStack_1210 = local_1580._16_8_;
      uStack_1208 = local_1580._24_8_;
      local_c80 = vandps_avx(local_1420,local_1580);
      local_ba0 = CONCAT44(fStack_159c,local_15a0);
      uStack_b98 = CONCAT44(fStack_1594,fStack_1598);
      uStack_b90 = CONCAT44(fStack_158c,fStack_1590);
      uStack_b88 = CONCAT44(fStack_1584,fStack_1588);
      local_b80._0_4_ = local_1420._0_4_;
      local_b80._4_4_ = local_1420._4_4_;
      local_b80._8_4_ = local_1420._8_4_;
      local_b80._12_4_ = local_1420._12_4_;
      local_b80._16_4_ = local_1420._16_4_;
      local_b80._20_4_ = local_1420._20_4_;
      local_b80._24_4_ = local_1420._24_4_;
      local_b80._28_4_ = local_1420._28_4_;
      auVar47._0_4_ = local_b80._0_4_ ^ auVar1._0_4_;
      auVar47._4_4_ = local_b80._4_4_ ^ auVar1._4_4_;
      auVar47._8_4_ = local_b80._8_4_ ^ auVar1._8_4_;
      auVar47._12_4_ = local_b80._12_4_ ^ auVar1._12_4_;
      auVar47._16_4_ = local_b80._16_4_ ^ auVar1._16_4_;
      auVar47._20_4_ = local_b80._20_4_ ^ auVar1._20_4_;
      auVar47._24_4_ = local_b80._24_4_ ^ auVar1._24_4_;
      auVar47._28_4_ = local_b80._28_4_ ^ auVar1._28_4_;
      auVar17._8_8_ = uStack_b98;
      auVar17._0_8_ = local_ba0;
      auVar17._16_8_ = uStack_b90;
      auVar17._24_8_ = uStack_b88;
      in_ZMM2 = ZEXT3264(auVar17);
      local_ca0 = vandps_avx(auVar47,auVar17);
      local_1780 = vorps_avx(local_c80,local_ca0);
      local_1670 = local_1710;
      local_16a0 = local_1780._0_8_;
      uStack_1698 = local_1780._8_8_;
      uStack_1690 = local_1780._16_8_;
      uStack_1688 = local_1780._24_8_;
      *local_1710 = local_1780;
      local_1710 = local_1710 + 1;
      local_1540 = ZEXT1632(auVar4);
      local_1520 = ZEXT1632(auVar5);
      local_1500 = ZEXT1632(auVar2);
      local_14e0 = ZEXT1632(auVar3);
      local_14c0 = ZEXT1632(auVar6);
      local_1160 = local_1240;
      uStack_1158 = uStack_1238;
      uStack_1150 = uStack_1230;
      uStack_1148 = uStack_1228;
      local_1080 = uVar7;
      uStack_1078 = uVar8;
      local_1040 = local_1060;
      uStack_1038 = uStack_1058;
      uStack_1030 = uStack_1050;
      uStack_1028 = uStack_1048;
      local_1000 = local_1020;
      uStack_ff8 = uStack_1018;
      uStack_ff0 = uStack_1010;
      uStack_fe8 = uStack_1008;
      local_fc0 = local_a20._0_8_;
      uStack_fb8 = local_a20._8_8_;
      uStack_fb0 = auStack_a10._0_8_;
      uStack_fa8 = auStack_a10._8_8_;
      local_f38 = local_f50;
      local_f20 = local_f50;
      local_f08 = local_f50;
      local_ea0 = local_ec0;
      uStack_e98 = uStack_eb8;
      uStack_e90 = uStack_eb0;
      uStack_e88 = uStack_ea8;
      local_b80 = local_1420;
      local_b20 = local_1240;
      uStack_b18 = uStack_1238;
      uStack_b10 = uStack_1230;
      uStack_b08 = uStack_1228;
      local_a7c = local_a80;
      local_a78 = local_a80;
      local_a74 = local_a80;
      local_a70 = local_a80;
      local_a6c = local_a80;
      local_a68 = local_a80;
      local_a64 = local_a80;
      local_a3c = local_a40;
      local_a38 = local_a40;
      local_a34 = local_a40;
      local_a30 = local_a40;
      local_a2c = local_a40;
      local_a28 = local_a40;
      local_a24 = local_a40;
      local_9fc = local_a00;
      local_9f8 = local_a00;
      local_9f4 = local_a00;
      local_9f0 = local_a00;
      local_9ec = local_a00;
      local_9e8 = local_a00;
      local_9e4 = local_a00;
      local_9bc = local_9c0;
      local_9b8 = local_9c0;
      local_9b4 = local_9c0;
      local_9b0 = local_9c0;
      local_9ac = local_9c0;
      local_9a8 = local_9c0;
      local_9a4 = local_9c0;
      local_97c = local_980;
      local_978 = local_980;
      local_974 = local_980;
      local_970 = local_980;
      local_96c = local_980;
      local_968 = local_980;
      local_964 = local_980;
      local_93c = local_940;
      local_938 = local_940;
      local_934 = local_940;
      local_930 = local_940;
      local_92c = local_940;
      local_928 = local_940;
      local_924 = local_940;
      local_8fc = local_900;
      local_8f8 = local_900;
      local_8f4 = local_900;
      local_8f0 = local_900;
      local_8ec = local_900;
      local_8e8 = local_900;
      local_8e4 = local_900;
      local_8bc = local_8c0;
      local_8b8 = local_8c0;
      local_8b4 = local_8c0;
      local_8b0 = local_8c0;
      local_8ac = local_8c0;
      local_8a8 = local_8c0;
      local_8a4 = local_8c0;
      local_87c = local_880;
      local_878 = local_880;
      local_874 = local_880;
      local_870 = local_880;
      local_86c = local_880;
      local_868 = local_880;
      local_864 = local_880;
      local_83c = local_840;
      local_838 = local_840;
      local_834 = local_840;
      local_830 = local_840;
      local_82c = local_840;
      local_828 = local_840;
      local_824 = local_840;
      local_7fc = local_800;
      local_7f8 = local_800;
      local_7f4 = local_800;
      local_7f0 = local_800;
      local_7ec = local_800;
      local_7e8 = local_800;
      local_7e4 = local_800;
      local_7bc = local_7c0;
      local_7b8 = local_7c0;
      local_7b4 = local_7c0;
      local_7b0 = local_7c0;
      local_7ac = local_7c0;
      local_7a8 = local_7c0;
      local_7a4 = local_7c0;
    }
    for (; local_15f8 = local_16b0, local_1738 = local_1648, local_175c + 3 < local_1704;
        local_175c = local_175c + 4) {
      local_1668 = local_1710;
      auVar3 = *(undefined1 (*) [16])*local_1710;
      local_15b8 = local_16e9;
      local_15c0 = local_1790;
      local_1790._0_8_ = auVar3._0_8_;
      local_5f0 = local_1790._0_8_;
      local_1790._8_8_ = auVar3._8_8_;
      uStack_5e8 = local_1790._8_8_;
      local_54 = 0x80000000;
      local_34 = 0x80000000;
      local_50 = 0x80000000;
      local_600 = 0x8000000080000000;
      uStack_5f8 = 0x8000000080000000;
      local_74 = 0;
      local_58 = 0;
      local_70 = 0;
      local_610 = 0;
      uStack_608 = 0;
      local_94 = 0x3f000000;
      local_78 = 0x3f000000;
      local_90 = 0x3f000000;
      local_620 = 0x3f0000003f000000;
      uStack_618 = 0x3f0000003f000000;
      local_b4 = 0x3f800000;
      local_98 = 0x3f800000;
      local_b0 = 0x3f800000;
      local_630 = 0x3f8000003f800000;
      uStack_628 = 0x3f8000003f800000;
      local_d4 = 0x3cc48f19;
      local_b8 = 0x3cc48f19;
      local_d0 = 0x3cc48f19;
      local_640 = 0x3cc48f193cc48f19;
      uStack_638 = 0x3cc48f193cc48f19;
      local_f4 = 0x3d2dbdcf;
      local_d8 = 0x3d2dbdcf;
      local_f0 = 0x3d2dbdcf;
      local_650 = 0x3d2dbdcf3d2dbdcf;
      uStack_648 = 0x3d2dbdcf3d2dbdcf;
      local_114 = 0x3d997dcc;
      local_f8 = 0x3d997dcc;
      local_110 = 0x3d997dcc;
      local_660 = 0x3d997dcc3d997dcc;
      uStack_658 = 0x3d997dcc3d997dcc;
      local_134 = 0x3d3a73d8;
      local_118 = 0x3d3a73d8;
      local_130 = 0x3d3a73d8;
      local_670 = 0x3d3a73d83d3a73d8;
      uStack_668 = 0x3d3a73d83d3a73d8;
      local_154 = 0x3f800000;
      local_138 = 0x3f800000;
      local_150 = 0x3f800000;
      local_680 = 0x3f8000003f800000;
      uStack_678 = 0x3f8000003f800000;
      local_174 = 0x3e2aaaf8;
      local_158 = 0x3e2aaaf8;
      local_170 = 0x3e2aaaf8;
      local_690 = 0x3e2aaaf83e2aaaf8;
      uStack_688 = 0x3e2aaaf83e2aaaf8;
      local_194 = 0x3fc90fdb;
      local_178 = 0x3fc90fdb;
      local_190 = 0x3fc90fdb;
      local_6a0 = 0x3fc90fdb3fc90fdb;
      uStack_698 = 0x3fc90fdb3fc90fdb;
      local_1b4 = 0x40490fdb;
      local_198 = 0x40490fdb;
      local_1b0 = 0x40490fdb;
      local_6b0 = 0x40490fdb40490fdb;
      uStack_6a8 = 0x40490fdb40490fdb;
      auVar2._8_8_ = 0x8000000080000000;
      auVar2._0_8_ = 0x8000000080000000;
      local_6c0 = vpand_avx(auVar2,auVar3);
      auVar23._8_8_ = 0x8000000080000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar2 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
      local_6d0 = vpandn_avx(auVar23,auVar3);
      local_2d0 = local_6d0._0_8_;
      uStack_2c8 = local_6d0._8_8_;
      auVar19._8_8_ = 0x3f0000003f000000;
      auVar19._0_8_ = 0x3f0000003f000000;
      local_6e0 = vcmpps_avx(local_6d0,auVar19,2);
      local_540 = local_6d0._0_8_;
      uStack_538 = local_6d0._8_8_;
      auVar5._8_8_ = 0x3f8000003f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      _local_4c0 = vsubps_avx(auVar5,local_6d0);
      local_4a0 = (float)local_4c0._0_4_ * 0.5;
      fStack_49c = (float)local_4c0._4_4_ * 0.5;
      fStack_498 = fStack_4b8 * 0.5;
      fStack_494 = fStack_4b4 * 0.5;
      auVar6._4_4_ = fStack_49c;
      auVar6._0_4_ = local_4a0;
      auVar6._8_4_ = fStack_498;
      auVar6._12_4_ = fStack_494;
      local_6f0 = vsqrtps_avx(auVar6);
      local_590 = local_6e0._0_8_;
      uStack_588 = local_6e0._8_8_;
      local_5a0 = local_6d0._0_8_;
      uStack_598 = local_6d0._8_8_;
      local_250 = vpand_avx(local_6e0,local_6d0);
      local_1f0 = local_6e0._0_8_;
      uStack_1e8 = local_6e0._8_8_;
      local_200 = local_6f0._0_8_;
      uStack_1f8 = local_6f0._8_8_;
      local_260 = vpandn_avx(local_6e0,local_6f0);
      local_700 = vpor_avx(local_250,local_260);
      local_4e0 = local_700._0_8_;
      uStack_4d8 = local_700._8_8_;
      local_4d0._0_4_ = local_700._0_4_;
      local_4d0._4_4_ = local_700._4_4_;
      uStack_4c8._0_4_ = local_700._8_4_;
      uStack_4c8._4_4_ = local_700._12_4_;
      local_710 = (float)local_4d0 * (float)local_4d0;
      fStack_70c = local_4d0._4_4_ * local_4d0._4_4_;
      fStack_708 = (float)uStack_4c8 * (float)uStack_4c8;
      fStack_704 = uStack_4c8._4_4_ * uStack_4c8._4_4_;
      local_500 = CONCAT44(fStack_70c,local_710);
      uStack_4f8 = CONCAT44(fStack_704,fStack_708);
      local_720 = local_710 * local_710;
      fStack_71c = fStack_70c * fStack_70c;
      fStack_718 = fStack_708 * fStack_708;
      fStack_714 = fStack_704 * fStack_704;
      local_420 = &local_720;
      local_3e0 = &local_650;
      local_3e8 = &local_670;
      local_3b0 = CONCAT44(fStack_71c,local_720);
      uStack_3a8 = CONCAT44(fStack_714,fStack_718);
      auVar35._4_4_ = fStack_71c;
      auVar35._0_4_ = local_720;
      auVar35._8_4_ = fStack_718;
      auVar35._12_4_ = fStack_714;
      local_3c0 = 0x3d2dbdcf3d2dbdcf;
      uStack_3b8 = 0x3d2dbdcf3d2dbdcf;
      auVar44._8_8_ = 0x3d2dbdcf3d2dbdcf;
      auVar44._0_8_ = 0x3d2dbdcf3d2dbdcf;
      local_3d0 = 0x3d3a73d83d3a73d8;
      uStack_3c8 = 0x3d3a73d83d3a73d8;
      auVar42._8_8_ = 0x3d3a73d83d3a73d8;
      auVar42._0_8_ = 0x3d3a73d83d3a73d8;
      local_750 = vfmadd213ps_fma(auVar44,auVar35,auVar42);
      local_3f8 = local_750;
      local_400 = &local_690;
      local_380 = CONCAT44(fStack_71c,local_720);
      uStack_378 = CONCAT44(fStack_714,fStack_718);
      auVar36._4_4_ = fStack_71c;
      auVar36._0_4_ = local_720;
      auVar36._8_4_ = fStack_718;
      auVar36._12_4_ = fStack_714;
      local_390 = local_750._0_8_;
      uStack_388 = local_750._8_8_;
      local_3a0 = 0x3e2aaaf83e2aaaf8;
      uStack_398 = 0x3e2aaaf83e2aaaf8;
      auVar40._8_8_ = 0x3e2aaaf83e2aaaf8;
      auVar40._0_8_ = 0x3e2aaaf83e2aaaf8;
      local_740 = vfmadd213ps_fma(local_750,auVar36,auVar40);
      local_410 = &local_640;
      local_418 = &local_660;
      local_350 = CONCAT44(fStack_71c,local_720);
      uStack_348 = CONCAT44(fStack_714,fStack_718);
      auVar37._4_4_ = fStack_71c;
      auVar37._0_4_ = local_720;
      auVar37._8_4_ = fStack_718;
      auVar37._12_4_ = fStack_714;
      local_360 = 0x3cc48f193cc48f19;
      uStack_358 = 0x3cc48f193cc48f19;
      auVar45._8_8_ = 0x3cc48f193cc48f19;
      auVar45._0_8_ = 0x3cc48f193cc48f19;
      local_370 = 0x3d997dcc3d997dcc;
      uStack_368 = 0x3d997dcc3d997dcc;
      auVar43._8_8_ = 0x3d997dcc3d997dcc;
      auVar43._0_8_ = 0x3d997dcc3d997dcc;
      local_770 = vfmadd213ps_fma(auVar45,auVar37,auVar43);
      local_428 = local_770;
      local_430 = &local_680;
      local_320 = CONCAT44(fStack_71c,local_720);
      uStack_318 = CONCAT44(fStack_714,fStack_718);
      auVar38._4_4_ = fStack_71c;
      auVar38._0_4_ = local_720;
      auVar38._8_4_ = fStack_718;
      auVar38._12_4_ = fStack_714;
      local_330 = local_770._0_8_;
      uStack_328 = local_770._8_8_;
      local_340 = 0x3f8000003f800000;
      uStack_338 = 0x3f8000003f800000;
      auVar41._8_8_ = 0x3f8000003f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      local_760 = vfmadd213ps_fma(local_770,auVar38,auVar41);
      local_438 = &local_710;
      local_440 = local_740;
      local_448 = local_760;
      local_2f0 = CONCAT44(fStack_70c,local_710);
      uStack_2e8 = CONCAT44(fStack_704,fStack_708);
      auVar39._4_4_ = fStack_70c;
      auVar39._0_4_ = local_710;
      auVar39._8_4_ = fStack_708;
      auVar39._12_4_ = fStack_704;
      local_300 = local_740._0_8_;
      uStack_2f8 = local_740._8_8_;
      local_310 = local_760._0_8_;
      uStack_308 = local_760._8_8_;
      local_730 = vfmadd213ps_fma(local_740,auVar39,local_760);
      local_520 = local_700._0_8_;
      uStack_518 = local_700._8_8_;
      local_510._0_4_ = local_730._0_4_;
      local_510._4_4_ = local_730._4_4_;
      uStack_508._0_4_ = local_730._8_4_;
      uStack_508._4_4_ = local_730._12_4_;
      local_780 = (float)local_510 * (float)local_4d0;
      fStack_77c = local_510._4_4_ * local_4d0._4_4_;
      fStack_778 = (float)uStack_508 * (float)uStack_4c8;
      fStack_774 = uStack_508._4_4_ * uStack_4c8._4_4_;
      local_270 = CONCAT44(fStack_77c,local_780);
      uStack_268 = CONCAT44(fStack_774,fStack_778);
      local_280 = local_6c0._0_8_;
      uStack_278 = local_6c0._8_8_;
      auVar21._8_8_ = uStack_268;
      auVar21._0_8_ = local_270;
      local_560 = vpor_avx(auVar21,local_6c0);
      auVar4._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar4._0_8_ = 0x3fc90fdb3fc90fdb;
      local_790 = vsubps_avx(auVar4,local_560);
      local_5b0 = vcmpps_avx(auVar3,ZEXT816(0),1);
      auVar3._8_8_ = 0x40490fdb40490fdb;
      auVar3._0_8_ = 0x40490fdb40490fdb;
      _local_480 = vpand_avx(local_5b0,auVar3);
      local_470 = CONCAT44(fStack_77c,local_780);
      uStack_468 = CONCAT44(fStack_774,fStack_778);
      local_290 = local_780 + local_780;
      fStack_28c = fStack_77c + fStack_77c;
      fStack_288 = fStack_778 + fStack_778;
      fStack_284 = fStack_774 + fStack_774;
      local_2a0 = local_6c0._0_8_;
      uStack_298 = local_6c0._8_8_;
      auVar20._4_4_ = fStack_28c;
      auVar20._0_4_ = local_290;
      auVar20._8_4_ = fStack_288;
      auVar20._12_4_ = fStack_284;
      _local_490 = vpor_avx(auVar20,local_6c0);
      local_7a0 = (float)local_480._0_4_ + (float)local_490._0_4_;
      fStack_79c = (float)local_480._4_4_ + (float)local_490._4_4_;
      fStack_798 = fStack_478 + fStack_488;
      fStack_794 = fStack_474 + fStack_484;
      local_5d0 = local_6e0._0_8_;
      uStack_5c8 = local_6e0._8_8_;
      local_5e0 = local_790._0_8_;
      uStack_5d8 = local_790._8_8_;
      local_2b0 = vpand_avx(local_6e0,local_790);
      local_220 = CONCAT44(fStack_79c,local_7a0);
      uStack_218 = CONCAT44(fStack_794,fStack_798);
      auVar22._8_8_ = uStack_218;
      auVar22._0_8_ = local_220;
      in_ZMM2 = ZEXT1664(auVar22);
      local_2c0 = vpand_avx(local_6e0 ^ auVar2,auVar22);
      local_1790 = vpor_avx(local_2b0,local_2c0);
      local_1650 = local_1710;
      local_1660 = local_1790._0_8_;
      uStack_1658 = local_1790._8_8_;
      *(undefined1 (*) [16])*local_1710 = local_1790;
      local_1710 = (undefined1 (*) [32])(*local_1710 + 0x10);
      local_5c0 = local_6b0;
      uStack_5b8 = uStack_6a8;
      local_580 = local_5f0;
      uStack_578 = uStack_5e8;
      local_570 = local_600;
      uStack_568 = uStack_5f8;
      local_550 = local_6a0;
      uStack_548 = uStack_698;
      local_530 = local_630;
      uStack_528 = uStack_628;
      local_510 = local_730._0_8_;
      uStack_508 = local_730._8_8_;
      local_4f0 = local_500;
      uStack_4e8 = uStack_4f8;
      local_4d0 = local_4e0;
      uStack_4c8 = uStack_4d8;
      local_4b0 = local_620;
      uStack_4a8 = uStack_618;
      local_460 = local_470;
      uStack_458 = uStack_468;
      local_408 = local_420;
      local_3f0 = local_420;
      local_3d8 = local_420;
      local_2e0 = local_620;
      uStack_2d8 = uStack_618;
      local_240 = local_610;
      uStack_238 = uStack_608;
      local_230 = local_5f0;
      uStack_228 = uStack_5e8;
      local_210 = local_6e0;
      local_1e0 = local_5f0;
      uStack_1d8 = uStack_5e8;
      local_1d0 = local_600;
      uStack_1c8 = uStack_5f8;
      uStack_1ac = local_1b0;
      uStack_1a8 = local_1b0;
      uStack_1a4 = local_1b0;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
      uStack_4c = local_50;
      uStack_48 = local_50;
      uStack_44 = local_50;
    }
    for (; local_175c < local_1704; local_175c = local_175c + 1) {
      local_15a8 = local_16e9;
      local_15b0 = local_1710;
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      fVar46 = acosf(*(float *)*local_1710);
      *(float *)*local_1710 = fVar46;
      local_1710 = (undefined1 (*) [32])(*local_1710 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}